

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O0

int handle_add_include(dmr_C *C,stream *stream,token **line,token *token)

{
  token *local_30;
  token *token_local;
  token **line_local;
  stream *stream_local;
  dmr_C *C_local;
  
  local_30 = token;
  while( true ) {
    local_30 = local_30->next;
    if (local_30 == &dmrC_eof_token_entry_) {
      return 1;
    }
    if ((SUB84(local_30->pos,0) & 0x3f) != 0xf) break;
    add_path_entry(C,local_30,(char *)((long)&((local_30->field_2).ident)->next + 4),
                   &C->isys_includepath);
  }
  dmrC_warning(C,local_30->pos,"expected path string");
  return 1;
}

Assistant:

static int handle_add_include(struct dmr_C *C, struct stream *stream, struct token **line, struct token *token)
{
        (void) stream;
        (void) line;
	for (;;) {
		token = token->next;
		if (dmrC_eof_token(token))
			return 1;
		if (dmrC_token_type(token) != TOKEN_STRING) {
			dmrC_warning(C, token->pos, "expected path string");
			return 1;
		}
		add_path_entry(C, token, token->string->data, &C->isys_includepath);
	}
}